

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooled_alloc.c
# Opt level: O2

void * pool_alloc(pool_alloc_t *p)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  pool_t *ppVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  
  puVar9 = (undefined8 *)p->free;
  if (puVar9 == (undefined8 *)0x0) {
    uVar2 = p->dsize;
    sVar3 = p->npools;
    ppVar7 = p->pools;
    if (sVar3 != 0) {
      sVar4 = ppVar7[sVar3 - 1].used;
      uVar1 = uVar2 + sVar4;
      if (uVar1 < 0x100000) {
        pvVar5 = ppVar7[sVar3 - 1].pool;
        ppVar7[sVar3 - 1].used = uVar1;
        return (void *)(sVar4 + (long)pvVar5);
      }
    }
    ppVar7 = (pool_t *)realloc(ppVar7,sVar3 * 0x10 + 0x10);
    if (ppVar7 == (pool_t *)0x0) {
      puVar9 = (undefined8 *)0x0;
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar2;
      p->pools = ppVar7;
      sVar3 = p->dsize;
      sVar4 = p->npools;
      puVar8 = (undefined8 *)
               malloc(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100000)) / auVar6,0) * sVar3);
      ppVar7[sVar4].pool = puVar8;
      puVar9 = (undefined8 *)0x0;
      if (puVar8 != (undefined8 *)0x0) {
        p->npools = sVar4 + 1;
        ppVar7[sVar4].used = sVar3;
        puVar9 = puVar8;
      }
    }
  }
  else {
    p->free = (void *)*puVar9;
  }
  return puVar9;
}

Assistant:

void *pool_alloc(pool_alloc_t *p) {
    pool_t *pool;
    void *ret;

    /* Look on free list */
    if (NULL != p->free) {
        ret = p->free;
	p->free = *((void **)p->free);
	return ret;
    }

    /* Look for space in the last pool */
    if (p->npools) {
        pool = &p->pools[p->npools - 1];
        if (pool->used + p->dsize < PSIZE) {
	    ret = ((char *) pool->pool) + pool->used;
	    pool->used += p->dsize;
	    return ret;
	}
    }

    /* Need a new pool */
    pool = new_pool(p);
    if (NULL == pool) return NULL;

    pool->used = p->dsize;
    return pool->pool;
}